

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O2

bool vkt::geometry::anon_unknown_0::verifyEmptyImage(TestLog *log,ConstPixelBufferAccess *image)

{
  ostringstream *poVar1;
  bool bVar2;
  TestLog *this;
  size_t __n;
  void *__buf;
  void *__buf_00;
  uint z;
  int y;
  allocator<char> aStack_348;
  allocator<char> local_347;
  allocator<char> local_346;
  allocator<char> local_345;
  int local_344;
  TestLog *local_340;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  Vec4 local_2b8;
  LogImageSet local_2a0;
  Vec4 color;
  Vec4 threshold;
  LogImage local_240;
  MessageBuilder local_1b0;
  
  poVar1 = &local_1b0.m_str;
  local_340 = log;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Expecting empty image");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_2b8.m_data[0] = 0.0;
  local_2b8.m_data[1] = 0.0;
  local_2b8.m_data[2] = 0.0;
  local_2b8.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&threshold,0.02);
  z = 0;
  do {
    local_344 = (image->m_size).m_data[1];
    if (local_344 <= (int)z) {
      local_1b0.m_log = local_340;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,"Image is valid");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_008a7f73:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      return local_344 <= (int)z;
    }
    for (y = 0; y < (image->m_size).m_data[0]; y = y + 1) {
      __n = (size_t)z;
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&color,(int)image,y,z);
      bVar2 = compareColors(&color,&local_2b8,&threshold);
      if (!bVar2) {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = local_340;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Found (at least) one bad pixel at ");
        std::ostream::operator<<(poVar1,y);
        std::operator<<((ostream *)poVar1,",");
        std::ostream::operator<<(poVar1,z);
        std::operator<<((ostream *)poVar1,". Pixel color is not background color.");
        this = tcu::MessageBuilder::operator<<
                         (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"LayerContent",&local_345);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"Layer content",&local_346);
        tcu::LogImageSet::LogImageSet(&local_2a0,&local_2d8,&local_2f8);
        tcu::LogImageSet::write(&local_2a0,(int)this,__buf,__n);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"Layer",&local_347);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"Layer",&aStack_348)
        ;
        tcu::LogImage::LogImage
                  (&local_240,&local_318,&local_338,image,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_240,(int)this,__buf_00,(size_t)image);
        tcu::TestLog::endImageSet(this);
        tcu::LogImage::~LogImage(&local_240);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_318);
        tcu::LogImageSet::~LogImageSet(&local_2a0);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
        goto LAB_008a7f73;
      }
    }
    z = z + 1;
  } while( true );
}

Assistant:

bool verifyEmptyImage (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image)
{
	log << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	const Vec4	black		(0.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	threshold	(0.02f);

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
	{
		const Vec4 color = image.getPixel(x, y);

		if (!compareColors(color, black, threshold))
		{
			log	<< tcu::TestLog::Message
				<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
				<< tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
				<< tcu::TestLog::Image("Layer", "Layer", image)
				<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	log << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}